

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
          (XmlUnitTestResultPrinter *this,char *output_file)

{
  long lVar1;
  ulong uVar2;
  char *in_RSI;
  undefined8 *in_RDI;
  EmptyTestEventListener *in_stack_ffffffffffffffb0;
  undefined8 *puVar3;
  allocator local_11;
  char *local_10;
  
  local_10 = in_RSI;
  EmptyTestEventListener::EmptyTestEventListener(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__XmlUnitTestResultPrinter_001c5f30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 1),local_10,&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  lVar1 = std::__cxx11::string::c_str();
  if (lVar1 != 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      return;
    }
  }
  puVar3 = (undefined8 *)&stderr;
  fprintf(_stderr,"XML output file may not be null\n");
  fflush((FILE *)*puVar3);
  exit(1);
}

Assistant:

XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(const char* output_file)
    : output_file_(output_file) {
  if (output_file_.c_str() == NULL || output_file_.empty()) {
    fprintf(stderr, "XML output file may not be null\n");
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
}